

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void CheckStacksSize(ImGuiWindow *window,bool write)

{
  ImGuiContext *pIVar1;
  int current_5;
  int current_4;
  int current_3;
  int current_2;
  int current_1;
  int current;
  short *p_backup;
  ImGuiContext *g;
  bool write_local;
  ImGuiWindow *window_local;
  
  pIVar1 = GImGui;
  if (write) {
    (window->DC).StackSizesBackup[0] = (short)(window->IDStack).Size;
  }
  if (write) {
    (window->DC).StackSizesBackup[1] = (short)(window->DC).GroupStack.Size;
  }
  if (write) {
    (window->DC).StackSizesBackup[2] = (short)(pIVar1->BeginPopupStack).Size;
  }
  if (write) {
    (window->DC).StackSizesBackup[3] = (short)(pIVar1->ColorModifiers).Size;
  }
  if (write) {
    (window->DC).StackSizesBackup[4] = (short)(pIVar1->StyleModifiers).Size;
  }
  if (write) {
    (window->DC).StackSizesBackup[5] = (short)(pIVar1->FontStack).Size;
  }
  return;
}

Assistant:

static void CheckStacksSize(ImGuiWindow* window, bool write)
{
    // NOT checking: DC.ItemWidth, DC.AllowKeyboardFocus, DC.ButtonRepeat, DC.TextWrapPos (per window) to allow user to conveniently push once and not pop (they are cleared on Begin)
    ImGuiContext& g = *GImGui;
    short* p_backup = &window->DC.StackSizesBackup[0];
    { int current = window->IDStack.Size;       if (write) *p_backup = (short)current; else IM_ASSERT(*p_backup == current && "PushID/PopID or TreeNode/TreePop Mismatch!");   p_backup++; }    // Too few or too many PopID()/TreePop()
    { int current = window->DC.GroupStack.Size; if (write) *p_backup = (short)current; else IM_ASSERT(*p_backup == current && "BeginGroup/EndGroup Mismatch!");                p_backup++; }    // Too few or too many EndGroup()
    { int current = g.BeginPopupStack.Size;     if (write) *p_backup = (short)current; else IM_ASSERT(*p_backup == current && "BeginMenu/EndMenu or BeginPopup/EndPopup Mismatch"); p_backup++;}// Too few or too many EndMenu()/EndPopup()
    // For color, style and font stacks there is an incentive to use Push/Begin/Pop/.../End patterns, so we relax our checks a little to allow them.
    { int current = g.ColorModifiers.Size;      if (write) *p_backup = (short)current; else IM_ASSERT(*p_backup >= current && "PushStyleColor/PopStyleColor Mismatch!");       p_backup++; }    // Too few or too many PopStyleColor()
    { int current = g.StyleModifiers.Size;      if (write) *p_backup = (short)current; else IM_ASSERT(*p_backup >= current && "PushStyleVar/PopStyleVar Mismatch!");           p_backup++; }    // Too few or too many PopStyleVar()
    { int current = g.FontStack.Size;           if (write) *p_backup = (short)current; else IM_ASSERT(*p_backup >= current && "PushFont/PopFont Mismatch!");                   p_backup++; }    // Too few or too many PopFont()
    IM_ASSERT(p_backup == window->DC.StackSizesBackup + IM_ARRAYSIZE(window->DC.StackSizesBackup));
}